

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

cargo_type_t cargo_get_option_type(cargo_t ctx,char *opt)

{
  int iVar1;
  cargo_type_t cVar2;
  size_t opt_i;
  size_t local_10;
  
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1bc3,"cargo_type_t cargo_get_option_type(cargo_t, const char *)");
  }
  if (opt != (char *)0x0) {
    iVar1 = _cargo_find_option_name(ctx,opt,&local_10,(size_t *)0x0);
    cVar2 = 0xffffffff;
    if (iVar1 == 0) {
      cVar2 = ctx->options[local_10].type;
    }
    return cVar2;
  }
  __assert_fail("opt",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1bc4,"cargo_type_t cargo_get_option_type(cargo_t, const char *)");
}

Assistant:

cargo_type_t cargo_get_option_type(cargo_t ctx, const char *opt)
{
    cargo_opt_t *o = NULL;
    size_t opt_i;
    assert(ctx);
    assert(opt);

    if (_cargo_find_option_name(ctx, opt, &opt_i, NULL))
    {
        CARGODBG(1, "No such option \"%s\"\n", opt);
        return -1;
    }

    o = &ctx->options[opt_i];

    return o->type;
}